

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool wasm::Match::Internal::
     Components<wasm::Select_*,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
     ::match(matched_t<wasm::Select_*> candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
            *matchers)

{
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar1;
  bool bVar2;
  
  ppEVar1 = matchers->curr->binder;
  if (ppEVar1 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
    *ppEVar1 = candidate->ifTrue;
  }
  bVar2 = Components<wasm::Select_*,_1,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::UnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
          ::match(candidate,&matchers->next);
  return bVar2;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }